

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt_env_infrastructure.cpp
# Opt level: O0

bool __thiscall
so_5::env_infrastructures::default_mt::impl::mt_env_infrastructure_t::final_deregister_coop
          (mt_env_infrastructure_t *this,string *coop_name)

{
  bool bVar1;
  string local_38 [32];
  string *local_18;
  string *coop_name_local;
  mt_env_infrastructure_t *this_local;
  
  local_18 = coop_name;
  coop_name_local = (string *)this;
  std::__cxx11::string::string(local_38,(string *)coop_name);
  bVar1 = coop_repo_t::final_deregister_coop(&this->m_coop_repo,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  return bVar1;
}

Assistant:

bool
mt_env_infrastructure_t::final_deregister_coop(
	std::string coop_name )
	{
		return m_coop_repo.final_deregister_coop( std::move(coop_name) );
	}